

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O3

bool __thiscall Js::BufferReader::Read<Js::DynamicProfileInfo::Bits>(BufferReader *this,Bits *data)

{
  ulong uVar1;
  char *pcVar2;
  code *pcVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  undefined4 *puVar8;
  
  uVar1 = this->lengthLeft;
  if (uVar1 < 5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3bc,"(false)","false");
    if (!bVar7) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  else {
    pcVar2 = this->current;
    data->field_0x4 = pcVar2[4];
    cVar4 = pcVar2[1];
    cVar5 = pcVar2[2];
    cVar6 = pcVar2[3];
    data->field_0x0 = pcVar2[0];
    data->field_0x1 = cVar4;
    data->field_0x2 = cVar5;
    data->field_0x3 = cVar6;
    this->current = this->current + 5;
    this->lengthLeft = this->lengthLeft - 5;
  }
  return 4 < uVar1;
}

Assistant:

bool Read(T * data)
        {
            if (lengthLeft < sizeof(T))
            {
                AssertOrFailFast(false);
                return false;
            }
            *data = *(T *)current;
            current += sizeof(T);
            lengthLeft -= sizeof(T);
            return true;
        }